

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::GetDependence
          (LoopDependenceAnalysis *this,Instruction *source,Instruction *destination,
          DistanceVector *distance_vector)

{
  pointer *this_00;
  char cVar1;
  bool bVar2;
  Op OVar3;
  Op OVar4;
  int iVar5;
  Instruction *pIVar6;
  Instruction *pIVar7;
  vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_> *pvVar8;
  iterator iVar9;
  iterator iVar10;
  reference ppVar11;
  reference ppLVar12;
  reference psVar13;
  type *ppIVar14;
  type *ppIVar15;
  SENode *pSVar16;
  type *ppSVar17;
  type *ppSVar18;
  bool local_559;
  Instruction *local_538;
  allocator<char> local_519;
  string local_518;
  LoopDependenceAnalysis *local_4f8;
  _Base_ptr local_4f0;
  _Rb_tree_const_iterator<const_spvtools::opt::Loop_*> local_4e8;
  undefined1 local_4d9;
  undefined1 local_4d8 [7];
  bool is_subscript_supported;
  set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  loops;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *subscript;
  iterator __end3_2;
  iterator __begin3_2;
  vector<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
  *__range3_2;
  undefined1 local_480 [7];
  bool supported;
  SENode *local_470;
  SENode *destination_node_1;
  SENode *source_node_1;
  type destination_subscript_1;
  type source_subscript_1;
  pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*> *elem;
  iterator __end3_1;
  iterator __begin3_1;
  set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *__range3_1;
  vector<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
  coupled_subscripts;
  set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  coupled_instructions;
  __normal_iterator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_*,_std::vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>_>
  local_3e0;
  __normal_iterator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_*,_std::vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>_>
  it_1;
  DistanceEntry *distance_entry_2;
  Loop *current_loop;
  iterator __end5;
  iterator __begin5;
  set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  *__range5;
  set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  current_loops;
  string local_378;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  uint local_2e0;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  DistanceEntry *local_290;
  DistanceEntry *distance_entry_1;
  string local_280;
  DistanceEntry *local_260;
  DistanceEntry *distance_entry;
  string local_250;
  Loop *local_230;
  Loop *loop;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> subscript_pair;
  SENode *destination_node;
  SENode *source_node;
  type local_200;
  type destination_subscript;
  type local_1f0;
  type source_subscript;
  iterator it;
  __normal_iterator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_*,_std::vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>_>
  local_1c8;
  __normal_iterator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_*,_std::vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>_>
  first_coupled;
  PartitionedSubscripts sets_of_subscripts;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  destination_subscripts;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  source_subscripts;
  string local_170;
  DistanceEntry local_150;
  reference local_128;
  DistanceEntry *entry_2;
  iterator __end3;
  iterator __begin3;
  vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_> *__range3;
  Instruction *destination_array;
  Instruction *source_array;
  reference local_d0;
  DistanceEntry *entry_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_> *__range4_1;
  Instruction *location_in_chain;
  Instruction *variable;
  Instruction *access_chain;
  undefined1 local_90 [7];
  bool source_is_chain;
  reference local_68;
  DistanceEntry *entry;
  iterator __end4;
  iterator __begin4;
  vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_> *__range4;
  int num_access_chains;
  Instruction *destination_access_chain;
  Instruction *source_access_chain;
  DistanceVector *distance_vector_local;
  Instruction *destination_local;
  Instruction *source_local;
  LoopDependenceAnalysis *this_local;
  
  MarkUnsusedDistanceEntriesAsIrrelevant(this,source,destination,distance_vector);
  pIVar6 = GetOperandDefinition(this,source,0);
  pIVar7 = GetOperandDefinition(this,destination,0);
  OVar3 = opt::Instruction::opcode(pIVar6);
  OVar4 = opt::Instruction::opcode(pIVar7);
  cVar1 = (OVar3 == OpAccessChain) + (OVar4 == OpAccessChain);
  if (cVar1 == '\0') {
    if (pIVar6 == pIVar7) {
      pvVar8 = DistanceVector::GetEntries(distance_vector);
      __end4 = std::
               vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>::
               begin(pvVar8);
      entry = (DistanceEntry *)
              std::
              vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>::
              end(pvVar8);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<spvtools::opt::DistanceEntry_*,_std::vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>_>
                                         *)&entry), bVar2) {
        local_68 = __gnu_cxx::
                   __normal_iterator<spvtools::opt::DistanceEntry_*,_std::vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>_>
                   ::operator*(&__end4);
        DistanceEntry::DistanceEntry((DistanceEntry *)local_90);
        memcpy(local_68,local_90,0x28);
        __gnu_cxx::
        __normal_iterator<spvtools::opt::DistanceEntry_*,_std::vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>_>
        ::operator++(&__end4);
      }
      this_local._7_1_ = 0;
    }
    else {
      this_local._7_1_ = 1;
    }
  }
  else if (cVar1 == '\x01') {
    OVar3 = opt::Instruction::opcode(pIVar6);
    local_538 = pIVar6;
    if (OVar3 == OpAccessChain) {
      local_538 = pIVar7;
      pIVar7 = pIVar6;
    }
    pIVar7 = GetOperandDefinition(this,pIVar7,0);
    if (local_538 == pIVar7) {
      pvVar8 = DistanceVector::GetEntries(distance_vector);
      __end4_1 = std::
                 vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                 ::begin(pvVar8);
      entry_1 = (DistanceEntry *)
                std::
                vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                ::end(pvVar8);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end4_1,
                                (__normal_iterator<spvtools::opt::DistanceEntry_*,_std::vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>_>
                                 *)&entry_1), bVar2) {
        local_d0 = __gnu_cxx::
                   __normal_iterator<spvtools::opt::DistanceEntry_*,_std::vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>_>
                   ::operator*(&__end4_1);
        DistanceEntry::DistanceEntry((DistanceEntry *)&source_array);
        memcpy(local_d0,&source_array,0x28);
        __gnu_cxx::
        __normal_iterator<spvtools::opt::DistanceEntry_*,_std::vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>_>
        ::operator++(&__end4_1);
      }
      this_local._7_1_ = 0;
    }
    else {
      this_local._7_1_ = 1;
    }
  }
  else {
    pIVar6 = GetOperandDefinition(this,pIVar6,0);
    pIVar7 = GetOperandDefinition(this,pIVar7,0);
    OVar3 = opt::Instruction::opcode(pIVar6);
    if ((OVar3 == OpAccessChain) ||
       (OVar3 = opt::Instruction::opcode(pIVar7), OVar3 == OpAccessChain)) {
      pvVar8 = DistanceVector::GetEntries(distance_vector);
      __end3 = std::
               vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>::
               begin(pvVar8);
      entry_2 = (DistanceEntry *)
                std::
                vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                ::end(pvVar8);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<spvtools::opt::DistanceEntry_*,_std::vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>_>
                                         *)&entry_2), bVar2) {
        local_128 = __gnu_cxx::
                    __normal_iterator<spvtools::opt::DistanceEntry_*,_std::vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>_>
                    ::operator*(&__end3);
        DistanceEntry::DistanceEntry(&local_150);
        memcpy(local_128,&local_150,0x28);
        __gnu_cxx::
        __normal_iterator<spvtools::opt::DistanceEntry_*,_std::vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>_>
        ::operator++(&__end3);
      }
      this_local._7_1_ = 0;
    }
    else if (pIVar6 == pIVar7) {
      GetSubscripts((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     *)&destination_subscripts.
                        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,this,source);
      GetSubscripts((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     *)&sets_of_subscripts.
                        super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,this,destination);
      PartitionSubscripts((PartitionedSubscripts *)&first_coupled,this,
                          (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           *)&destination_subscripts.
                              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           *)&sets_of_subscripts.
                              super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar9 = std::
              begin<std::vector<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>,std::allocator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>>>>
                        ((vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                          *)&first_coupled);
      iVar10 = std::
               end<std::vector<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>,std::allocator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>>>>
                         ((vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                           *)&first_coupled);
      local_1c8 = std::
                  partition<__gnu_cxx::__normal_iterator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>*,std::vector<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>,std::allocator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>>>>,spvtools::opt::LoopDependenceAnalysis::GetDependence(spvtools::opt::Instruction_const*,spvtools::opt::Instruction_const*,spvtools::opt::DistanceVector*)::__0>
                            (iVar9._M_current,iVar10._M_current);
      source_subscript =
           (type)std::
                 begin<std::vector<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>,std::allocator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>>>>
                           ((vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                             *)&first_coupled);
      while (bVar2 = __gnu_cxx::operator<
                               ((__normal_iterator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_*,_std::vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>_>
                                 *)&source_subscript,&local_1c8), bVar2) {
        psVar13 = __gnu_cxx::
                  __normal_iterator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_*,_std::vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>_>
                  ::operator*((__normal_iterator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_*,_std::vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>_>
                               *)&source_subscript);
        destination_subscript =
             (type)std::
                   set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
                   ::begin(psVar13);
        ppVar11 = std::
                  _Rb_tree_const_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>
                  ::operator*((_Rb_tree_const_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>
                               *)&destination_subscript);
        ppIVar14 = std::get<0ul,spvtools::opt::Instruction*,spvtools::opt::Instruction*>(ppVar11);
        local_1f0 = *ppIVar14;
        psVar13 = __gnu_cxx::
                  __normal_iterator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_*,_std::vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>_>
                  ::operator*((__normal_iterator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_*,_std::vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>_>
                               *)&source_subscript);
        source_node = (SENode *)
                      std::
                      set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
                      ::begin(psVar13);
        ppVar11 = std::
                  _Rb_tree_const_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>
                  ::operator*((_Rb_tree_const_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>
                               *)&source_node);
        ppIVar15 = std::get<1ul,spvtools::opt::Instruction*,spvtools::opt::Instruction*>(ppVar11);
        local_200 = *ppIVar15;
        pSVar16 = ScalarEvolutionAnalysis::AnalyzeInstruction(&this->scalar_evolution_,local_1f0);
        destination_node =
             ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar16);
        pSVar16 = ScalarEvolutionAnalysis::AnalyzeInstruction(&this->scalar_evolution_,local_200);
        subscript_pair.second =
             ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar16);
        _loop = std::make_pair<spvtools::opt::SENode*&,spvtools::opt::SENode*&>
                          (&destination_node,&subscript_pair.second);
        local_230 = GetLoopForSubscriptPair
                              (this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)&loop)
        ;
        if ((local_230 == (Loop *)0x0) || (bVar2 = IsSupportedLoop(this,local_230), bVar2)) {
          iVar5 = (**destination_node->_vptr_SENode)();
          if ((iVar5 == 6) || (iVar5 = (**(subscript_pair.second)->_vptr_SENode)(), iVar5 == 6)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_280,
                       "GetDependence found source_node || destination_node as CanNotCompute. Abandoning evaluation for this subscript."
                       ,(allocator<char> *)((long)&distance_entry_1 + 7));
            PrintDebug(this,&local_280);
            std::__cxx11::string::~string((string *)&local_280);
            std::allocator<char>::~allocator((allocator<char> *)((long)&distance_entry_1 + 7));
            local_290 = GetDistanceEntryForSubscriptPair
                                  (this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)
                                        &loop,distance_vector);
            if (local_290 != (DistanceEntry *)0x0) {
              local_290->direction = ALL;
            }
            goto LAB_00a9fce9;
          }
          bVar2 = IsZIV(this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)&loop);
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2b0,"Found a ZIV subscript pair",&local_2b1);
            PrintDebug(this,&local_2b0);
            std::__cxx11::string::~string((string *)&local_2b0);
            std::allocator<char>::~allocator(&local_2b1);
            bVar2 = ZIVTest(this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)&loop);
            if (bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2d8,"Proved independence with ZIVTest.",&local_2d9);
              PrintDebug(this,&local_2d8);
              std::__cxx11::string::~string((string *)&local_2d8);
              std::allocator<char>::~allocator(&local_2d9);
              this_local._7_1_ = 1;
              local_2e0 = 1;
              goto LAB_00aa00cb;
            }
          }
          bVar2 = IsSIV(this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)&loop);
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_300,"Found a SIV subscript pair.",&local_301);
            PrintDebug(this,&local_300);
            std::__cxx11::string::~string((string *)&local_300);
            std::allocator<char>::~allocator(&local_301);
            bVar2 = SIVTest(this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)&loop,
                            distance_vector);
            if (bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_328,"Proved independence with SIVTest.",&local_329);
              PrintDebug(this,&local_328);
              std::__cxx11::string::~string((string *)&local_328);
              std::allocator<char>::~allocator(&local_329);
              this_local._7_1_ = 1;
              local_2e0 = 1;
              goto LAB_00aa00cb;
            }
          }
          bVar2 = IsMIV(this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)&loop);
          if (!bVar2) goto LAB_00a9fce9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_350,"Found a MIV subscript pair.",&local_351);
          PrintDebug(this,&local_350);
          std::__cxx11::string::~string((string *)&local_350);
          std::allocator<char>::~allocator(&local_351);
          bVar2 = GCDMIVTest(this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)&loop);
          if (!bVar2) goto LAB_00a9fce9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_378,"Proved independence with the GCD test.",
                     (allocator<char> *)
                     ((long)&current_loops._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
          PrintDebug(this,&local_378);
          std::__cxx11::string::~string((string *)&local_378);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&current_loops._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
          CollectLoops((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                        *)&__range5,this,destination_node,subscript_pair.second);
          __end5 = std::
                   set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                   ::begin((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                            *)&__range5);
          current_loop = (Loop *)std::
                                 set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                                 ::end((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                                        *)&__range5);
          while (bVar2 = std::operator!=(&__end5,(_Self *)&current_loop), bVar2) {
            ppLVar12 = std::_Rb_tree_const_iterator<const_spvtools::opt::Loop_*>::operator*(&__end5)
            ;
            it_1._M_current =
                 (set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
                  *)GetDistanceEntryForLoop(this,*ppLVar12,distance_vector);
            ((DistanceEntry *)it_1._M_current)->direction = NONE;
            std::_Rb_tree_const_iterator<const_spvtools::opt::Loop_*>::operator++(&__end5);
          }
          this_local._7_1_ = 1;
          local_2e0 = 1;
          std::
          set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
          ::~set((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                  *)&__range5);
          goto LAB_00aa00cb;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_250,
                   "GetDependence found an unsupported loop form. Assuming <=> for loop.",
                   (allocator<char> *)((long)&distance_entry + 7));
        PrintDebug(this,&local_250);
        std::__cxx11::string::~string((string *)&local_250);
        std::allocator<char>::~allocator((allocator<char> *)((long)&distance_entry + 7));
        local_260 = GetDistanceEntryForSubscriptPair
                              (this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)&loop,
                               distance_vector);
        if (local_260 != (DistanceEntry *)0x0) {
          local_260->direction = ALL;
        }
LAB_00a9fce9:
        __gnu_cxx::
        __normal_iterator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_*,_std::vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>_>
        ::operator++((__normal_iterator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_*,_std::vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>_>
                      *)&source_subscript);
      }
      local_3e0._M_current = local_1c8._M_current;
      while( true ) {
        coupled_instructions._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)std::
                     end<std::vector<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>,std::allocator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>>>>
                               ((vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                                 *)&first_coupled);
        bVar2 = __gnu_cxx::operator<
                          (&local_3e0,
                           (__normal_iterator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_*,_std::vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>_>
                            *)&coupled_instructions._M_t._M_impl.super__Rb_tree_header._M_node_count
                          );
        if (!bVar2) break;
        psVar13 = __gnu_cxx::
                  __normal_iterator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_*,_std::vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>_>
                  ::operator*(&local_3e0);
        std::
        set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
        ::set((set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
               *)&coupled_subscripts.
                  super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar13);
        memset(&__range3_1,0,0x18);
        std::
        vector<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
        ::vector((vector<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                  *)&__range3_1);
        this_00 = &coupled_subscripts.
                   super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __end3_1 = std::
                   set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
                   ::begin((set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
                            *)this_00);
        elem = (pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*> *)
               std::
               set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
               ::end((set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
                      *)this_00);
        while (bVar2 = std::operator!=(&__end3_1,(_Self *)&elem), bVar2) {
          source_subscript_1 =
               (type)std::
                     _Rb_tree_const_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>
                     ::operator*(&__end3_1);
          ppIVar14 = std::get<0ul,spvtools::opt::Instruction*,spvtools::opt::Instruction*>
                               ((pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*> *)
                                source_subscript_1);
          destination_subscript_1 = *ppIVar14;
          ppIVar15 = std::get<1ul,spvtools::opt::Instruction*,spvtools::opt::Instruction*>
                               ((pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*> *)
                                source_subscript_1);
          source_node_1 = (SENode *)*ppIVar15;
          pSVar16 = ScalarEvolutionAnalysis::AnalyzeInstruction
                              (&this->scalar_evolution_,destination_subscript_1);
          destination_node_1 =
               ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar16);
          pSVar16 = ScalarEvolutionAnalysis::AnalyzeInstruction
                              (&this->scalar_evolution_,(Instruction *)source_node_1);
          local_470 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar16);
          std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>::
          pair<spvtools::opt::SENode_*&,_spvtools::opt::SENode_*&,_true>
                    ((pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_480,
                     &destination_node_1,&local_470);
          std::
          vector<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
          ::push_back((vector<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                       *)&__range3_1,(value_type *)local_480);
          std::
          _Rb_tree_const_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>
          ::operator++(&__end3_1);
        }
        __range3_2._7_1_ = true;
        __end3_2 = std::
                   vector<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                   ::begin((vector<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                            *)&__range3_1);
        subscript = (pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)
                    std::
                    vector<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                    ::end((vector<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                           *)&__range3_1);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3_2,
                                  (__normal_iterator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_*,_std::vector<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>_>
                                   *)&subscript), bVar2) {
          loops._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (size_t)__gnu_cxx::
                       __normal_iterator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_*,_std::vector<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>_>
                       ::operator*(&__end3_2);
          ppSVar17 = std::get<0ul,spvtools::opt::SENode*,spvtools::opt::SENode*>
                               ((pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)
                                loops._M_t._M_impl.super__Rb_tree_header._M_node_count);
          pSVar16 = *ppSVar17;
          ppSVar18 = std::get<1ul,spvtools::opt::SENode*,spvtools::opt::SENode*>
                               ((pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)
                                loops._M_t._M_impl.super__Rb_tree_header._M_node_count);
          CollectLoops((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                        *)local_4d8,this,pSVar16,*ppSVar18);
          local_4e8._M_node =
               (_Base_ptr)
               std::
               begin<std::set<spvtools::opt::Loop_const*,std::less<spvtools::opt::Loop_const*>,std::allocator<spvtools::opt::Loop_const*>>>
                         ((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                           *)local_4d8);
          local_4f0 = (_Base_ptr)
                      std::
                      end<std::set<spvtools::opt::Loop_const*,std::less<spvtools::opt::Loop_const*>,std::allocator<spvtools::opt::Loop_const*>>>
                                ((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                                  *)local_4d8);
          local_4f8 = this;
          local_4d9 = std::
                      all_of<std::_Rb_tree_const_iterator<spvtools::opt::Loop_const*>,spvtools::opt::LoopDependenceAnalysis::GetDependence(spvtools::opt::Instruction_const*,spvtools::opt::Instruction_const*,spvtools::opt::DistanceVector*)::__1>
                                (local_4e8,
                                 (_Rb_tree_const_iterator<const_spvtools::opt::Loop_*>)local_4f0,
                                 (anon_class_8_1_8991fb9c)this);
          local_559 = false;
          if (__range3_2._7_1_ != false) {
            local_559 = (bool)local_4d9;
          }
          __range3_2._7_1_ = local_559;
          std::
          set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
          ::~set((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                  *)local_4d8);
          __gnu_cxx::
          __normal_iterator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_*,_std::vector<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>_>
          ::operator++(&__end3_2);
        }
        bVar2 = DeltaTest(this,(vector<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                                *)&__range3_1,distance_vector);
        if (bVar2) {
          this_local._7_1_ = 1;
        }
        local_2e0 = (uint)bVar2;
        std::
        vector<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
        ::~vector((vector<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                   *)&__range3_1);
        std::
        set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
        ::~set((set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
                *)&coupled_subscripts.
                   super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (local_2e0 != 0) goto LAB_00aa00cb;
        __gnu_cxx::
        __normal_iterator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_*,_std::vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>_>
        ::operator++(&local_3e0);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_518,
                 "Couldn\'t prove independence.\nAll possible direction information has been collected in the input DistanceVector."
                 ,&local_519);
      PrintDebug(this,&local_518);
      std::__cxx11::string::~string((string *)&local_518);
      std::allocator<char>::~allocator(&local_519);
      this_local._7_1_ = 0;
      local_2e0 = 1;
LAB_00aa00cb:
      std::
      vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
      ::~vector((vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                 *)&first_coupled);
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )&sets_of_subscripts.
                super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )&destination_subscripts.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,"Proved independence through different arrays.",
                 (allocator<char> *)
                 ((long)&source_subscripts.
                         super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      PrintDebug(this,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&source_subscripts.
                         super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      this_local._7_1_ = 1;
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool LoopDependenceAnalysis::GetDependence(const Instruction* source,
                                           const Instruction* destination,
                                           DistanceVector* distance_vector) {
  // Start off by finding and marking all the loops in |loops_| that are
  // irrelevant to the dependence analysis.
  MarkUnsusedDistanceEntriesAsIrrelevant(source, destination, distance_vector);

  Instruction* source_access_chain = GetOperandDefinition(source, 0);
  Instruction* destination_access_chain = GetOperandDefinition(destination, 0);

  auto num_access_chains =
      (source_access_chain->opcode() == spv::Op::OpAccessChain) +
      (destination_access_chain->opcode() == spv::Op::OpAccessChain);

  // If neither is an access chain, then they are load/store to a variable.
  if (num_access_chains == 0) {
    if (source_access_chain != destination_access_chain) {
      // Not the same location, report independence
      return true;
    } else {
      // Accessing the same variable
      for (auto& entry : distance_vector->GetEntries()) {
        entry = DistanceEntry();
      }
      return false;
    }
  }

  // If only one is an access chain, it could be accessing a part of a struct
  if (num_access_chains == 1) {
    auto source_is_chain =
        source_access_chain->opcode() == spv::Op::OpAccessChain;
    auto access_chain =
        source_is_chain ? source_access_chain : destination_access_chain;
    auto variable =
        source_is_chain ? destination_access_chain : source_access_chain;

    auto location_in_chain = GetOperandDefinition(access_chain, 0);

    if (variable != location_in_chain) {
      // Not the same location, report independence
      return true;
    } else {
      // Accessing the same variable
      for (auto& entry : distance_vector->GetEntries()) {
        entry = DistanceEntry();
      }
      return false;
    }
  }

  // If the access chains aren't collecting from the same structure there is no
  // dependence.
  Instruction* source_array = GetOperandDefinition(source_access_chain, 0);
  Instruction* destination_array =
      GetOperandDefinition(destination_access_chain, 0);

  // Nested access chains are not supported yet, bail out.
  if (source_array->opcode() == spv::Op::OpAccessChain ||
      destination_array->opcode() == spv::Op::OpAccessChain) {
    for (auto& entry : distance_vector->GetEntries()) {
      entry = DistanceEntry();
    }
    return false;
  }

  if (source_array != destination_array) {
    PrintDebug("Proved independence through different arrays.");
    return true;
  }

  // To handle multiple subscripts we must get every operand in the access
  // chains past the first.
  std::vector<Instruction*> source_subscripts = GetSubscripts(source);
  std::vector<Instruction*> destination_subscripts = GetSubscripts(destination);

  auto sets_of_subscripts =
      PartitionSubscripts(source_subscripts, destination_subscripts);

  auto first_coupled = std::partition(
      std::begin(sets_of_subscripts), std::end(sets_of_subscripts),
      [](const std::set<std::pair<Instruction*, Instruction*>>& set) {
        return set.size() == 1;
      });

  // Go through each subscript testing for independence.
  // If any subscript results in independence, we prove independence between the
  // load and store.
  // If we can't prove independence we store what information we can gather in
  // a DistanceVector.
  for (auto it = std::begin(sets_of_subscripts); it < first_coupled; ++it) {
    auto source_subscript = std::get<0>(*(*it).begin());
    auto destination_subscript = std::get<1>(*(*it).begin());

    SENode* source_node = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.AnalyzeInstruction(source_subscript));
    SENode* destination_node = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.AnalyzeInstruction(destination_subscript));

    // Check the loops are in a form we support.
    auto subscript_pair = std::make_pair(source_node, destination_node);

    const Loop* loop = GetLoopForSubscriptPair(subscript_pair);
    if (loop) {
      if (!IsSupportedLoop(loop)) {
        PrintDebug(
            "GetDependence found an unsupported loop form. Assuming <=> for "
            "loop.");
        DistanceEntry* distance_entry =
            GetDistanceEntryForSubscriptPair(subscript_pair, distance_vector);
        if (distance_entry) {
          distance_entry->direction = DistanceEntry::Directions::ALL;
        }
        continue;
      }
    }

    // If either node is simplified to a CanNotCompute we can't perform any
    // analysis so must assume <=> dependence and return.
    if (source_node->GetType() == SENode::CanNotCompute ||
        destination_node->GetType() == SENode::CanNotCompute) {
      // Record the <=> dependence if we can get a DistanceEntry
      PrintDebug(
          "GetDependence found source_node || destination_node as "
          "CanNotCompute. Abandoning evaluation for this subscript.");
      DistanceEntry* distance_entry =
          GetDistanceEntryForSubscriptPair(subscript_pair, distance_vector);
      if (distance_entry) {
        distance_entry->direction = DistanceEntry::Directions::ALL;
      }
      continue;
    }

    // We have no induction variables so can apply a ZIV test.
    if (IsZIV(subscript_pair)) {
      PrintDebug("Found a ZIV subscript pair");
      if (ZIVTest(subscript_pair)) {
        PrintDebug("Proved independence with ZIVTest.");
        return true;
      }
    }

    // We have only one induction variable so should attempt an SIV test.
    if (IsSIV(subscript_pair)) {
      PrintDebug("Found a SIV subscript pair.");
      if (SIVTest(subscript_pair, distance_vector)) {
        PrintDebug("Proved independence with SIVTest.");
        return true;
      }
    }

    // We have multiple induction variables so should attempt an MIV test.
    if (IsMIV(subscript_pair)) {
      PrintDebug("Found a MIV subscript pair.");
      if (GCDMIVTest(subscript_pair)) {
        PrintDebug("Proved independence with the GCD test.");
        auto current_loops = CollectLoops(source_node, destination_node);

        for (auto current_loop : current_loops) {
          auto distance_entry =
              GetDistanceEntryForLoop(current_loop, distance_vector);
          distance_entry->direction = DistanceEntry::Directions::NONE;
        }
        return true;
      }
    }
  }

  for (auto it = first_coupled; it < std::end(sets_of_subscripts); ++it) {
    auto coupled_instructions = *it;
    std::vector<SubscriptPair> coupled_subscripts{};

    for (const auto& elem : coupled_instructions) {
      auto source_subscript = std::get<0>(elem);
      auto destination_subscript = std::get<1>(elem);

      SENode* source_node = scalar_evolution_.SimplifyExpression(
          scalar_evolution_.AnalyzeInstruction(source_subscript));
      SENode* destination_node = scalar_evolution_.SimplifyExpression(
          scalar_evolution_.AnalyzeInstruction(destination_subscript));

      coupled_subscripts.push_back({source_node, destination_node});
    }

    auto supported = true;

    for (const auto& subscript : coupled_subscripts) {
      auto loops = CollectLoops(std::get<0>(subscript), std::get<1>(subscript));

      auto is_subscript_supported =
          std::all_of(std::begin(loops), std::end(loops),
                      [this](const Loop* l) { return IsSupportedLoop(l); });

      supported = supported && is_subscript_supported;
    }

    if (DeltaTest(coupled_subscripts, distance_vector)) {
      return true;
    }
  }

  // We were unable to prove independence so must gather all of the direction
  // information we found.
  PrintDebug(
      "Couldn't prove independence.\n"
      "All possible direction information has been collected in the input "
      "DistanceVector.");

  return false;
}